

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O3

void ON_SortIntArray(sort_algorithm sort_algorithm,int *a,size_t nel)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int iVar10;
  int *piVar11;
  ulong uVar12;
  int *piVar13;
  int *lostk [62];
  undefined8 auStack_3f8 [62];
  undefined8 auStack_208 [62];
  
  if (sort_algorithm == heap_sort) {
    if (1 < nel && a != (int *)0x0) {
      uVar4 = nel >> 1;
      piVar3 = a + (nel - 1);
      uVar5 = nel - 1;
      do {
        if (uVar4 == 0) {
          iVar2 = *piVar3;
          *piVar3 = *a;
          uVar5 = uVar5 - 1;
          if (uVar5 == 0) {
            *a = iVar2;
            return;
          }
          piVar3 = piVar3 + -1;
          uVar4 = 0;
        }
        else {
          iVar2 = a[uVar4 - 1];
          uVar4 = uVar4 - 1;
        }
        piVar6 = a + uVar4;
        uVar12 = uVar4;
        while (uVar1 = uVar12 * 2, uVar1 < uVar5) {
          piVar9 = a + uVar1 + 1;
          uVar12 = uVar1 | 1;
          if (uVar12 < uVar5) {
            iVar7 = *piVar9;
            iVar10 = a[uVar1 + 2];
            iVar8 = iVar7;
            if (iVar7 < iVar10) {
              iVar8 = iVar10;
            }
            if (iVar7 < iVar10) {
              piVar9 = a + uVar1 + 2;
            }
            uVar12 = uVar12 + (iVar7 < iVar10);
          }
          else {
            iVar8 = *piVar9;
          }
          if (iVar8 <= iVar2) break;
          *piVar6 = iVar8;
          piVar6 = piVar9;
        }
        *piVar6 = iVar2;
      } while( true );
    }
  }
  else if (1 < nel && a != (int *)0x0) {
    uVar4 = 0;
    piVar3 = a + (nel - 1);
LAB_005b138d:
    while( true ) {
      iVar2 = (int)uVar4;
      uVar5 = ((long)piVar3 - (long)a >> 2) + 1;
      if (uVar5 < 9) break;
      piVar6 = (int *)((long)a + (uVar5 & 0xfffffffffffffffe) * 2);
      iVar8 = *a;
      iVar10 = *piVar6;
      iVar7 = iVar8;
      if (iVar10 < iVar8) {
        *a = iVar10;
        *piVar6 = iVar8;
        iVar7 = *a;
        iVar10 = iVar8;
      }
      iVar8 = *piVar3;
      if (iVar8 < iVar7) {
        *a = iVar8;
        *piVar3 = iVar7;
        iVar10 = *piVar6;
        iVar8 = iVar7;
      }
      piVar9 = a;
      piVar11 = piVar3;
      if (iVar8 < iVar10) {
        *piVar6 = iVar8;
        *piVar3 = iVar10;
      }
LAB_005b13e5:
      if (piVar9 < piVar6) {
        do {
          piVar9 = piVar9 + 1;
          if (piVar6 <= piVar9) break;
        } while (*piVar9 <= *piVar6);
      }
      if (piVar6 <= piVar9) {
        do {
          piVar9 = piVar9 + 1;
          if (piVar3 < piVar9) break;
        } while (*piVar9 <= *piVar6);
      }
      do {
        piVar13 = piVar11;
        piVar11 = piVar13 + -1;
        if (piVar11 <= piVar6) break;
      } while (*piVar6 < *piVar11);
      if (piVar9 <= piVar11) {
        iVar8 = *piVar9;
        *piVar9 = *piVar11;
        *piVar11 = iVar8;
        if (piVar11 == piVar6) {
          piVar6 = piVar9;
        }
        goto LAB_005b13e5;
      }
      if (piVar6 < piVar13) {
        do {
          piVar13 = piVar11;
          if (piVar13 <= piVar6) break;
          piVar11 = piVar13 + -1;
        } while (*piVar13 == *piVar6);
      }
      if (piVar13 <= piVar6) {
        do {
          piVar13 = piVar13 + -1;
          if (piVar13 <= a) break;
        } while (*piVar13 == *piVar6);
      }
      if ((long)piVar13 - (long)a < (long)piVar3 - (long)piVar9) goto LAB_005b1514;
      if (a < piVar13) {
        auStack_208[iVar2] = a;
        auStack_3f8[iVar2] = piVar13;
        uVar4 = (ulong)(iVar2 + 1);
      }
      iVar2 = (int)uVar4;
      a = piVar9;
      if (piVar3 <= piVar9) goto LAB_005b1537;
    }
    if (a < piVar3) {
      do {
        piVar6 = a;
        if (a + 1 <= piVar3) {
          iVar8 = *a;
          piVar9 = a + 1;
          do {
            if (iVar8 < *piVar9) {
              piVar6 = piVar9;
              iVar8 = *piVar9;
            }
            piVar9 = piVar9 + 1;
          } while (piVar9 <= piVar3);
        }
        iVar8 = *piVar6;
        *piVar6 = *piVar3;
        *piVar3 = iVar8;
        piVar3 = piVar3 + -1;
      } while (a < piVar3);
    }
    goto LAB_005b1537;
  }
  return;
LAB_005b1514:
  if (piVar9 < piVar3) {
    auStack_208[iVar2] = piVar9;
    auStack_3f8[iVar2] = piVar3;
    uVar4 = (ulong)(iVar2 + 1);
  }
  iVar2 = (int)uVar4;
  piVar3 = piVar13;
  if (piVar13 <= a) {
LAB_005b1537:
    if (iVar2 < 1) {
      return;
    }
    uVar4 = (ulong)(iVar2 - 1);
    a = (int *)auStack_208[uVar4];
    piVar3 = (int *)auStack_3f8[uVar4];
  }
  goto LAB_005b138d;
}

Assistant:

void ON_SortIntArray(
        ON::sort_algorithm sort_algorithm,
        int* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_int(a,nel);
  else
    ON_qsort_int(a,nel);
}